

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i64 fts5GetRowidLimit(sqlite3_value *pVal,i64 iDefault)

{
  ushort uVar1;
  i64 iVar2;
  Mem *pMem;
  
  if (pVal != (sqlite3_value *)0x0) {
    uVar1 = pVal->flags;
    if ((uVar1 & 0xf) == 2) {
      applyNumericAffinity(pVal,0);
      uVar1 = pVal->flags;
    }
    if ((0x50505050U >> (uVar1 & 0x1f) & 1) != 0) {
      iVar2 = sqlite3VdbeIntValue(pVal);
      return iVar2;
    }
  }
  return iDefault;
}

Assistant:

static i64 fts5GetRowidLimit(sqlite3_value *pVal, i64 iDefault){
  if( pVal ){
    int eType = sqlite3_value_numeric_type(pVal);
    if( eType==SQLITE_INTEGER ){
      return sqlite3_value_int64(pVal);
    }
  }
  return iDefault;
}